

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

int amqp_simple_wait_frame_noblock
              (amqp_connection_state_t state,amqp_frame_t *decoded_frame,timeval *timeout)

{
  void *__src;
  void *in_RSI;
  long in_RDI;
  amqp_frame_t *f;
  timeval *in_stack_00000058;
  amqp_frame_t *in_stack_00000060;
  amqp_connection_state_t in_stack_00000068;
  undefined4 local_4;
  
  if (*(long *)(in_RDI + 0xf0) == 0) {
    local_4 = wait_frame_inner(in_stack_00000068,in_stack_00000060,in_stack_00000058);
  }
  else {
    __src = *(void **)(*(long *)(in_RDI + 0xf0) + 8);
    *(undefined8 *)(in_RDI + 0xf0) = **(undefined8 **)(in_RDI + 0xf0);
    if (*(long *)(in_RDI + 0xf0) == 0) {
      *(undefined8 *)(in_RDI + 0xf8) = 0;
    }
    memcpy(in_RSI,__src,0x30);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int amqp_simple_wait_frame_noblock(amqp_connection_state_t state,
                                   amqp_frame_t *decoded_frame,
                                   struct timeval *timeout)
{
  if (state->first_queued_frame != NULL) {
    amqp_frame_t *f = (amqp_frame_t *) state->first_queued_frame->data;
    state->first_queued_frame = state->first_queued_frame->next;
    if (state->first_queued_frame == NULL) {
      state->last_queued_frame = NULL;
    }
    *decoded_frame = *f;
    return AMQP_STATUS_OK;
  } else {
    return wait_frame_inner(state, decoded_frame, timeout);
  }
}